

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall Compiler::compile(Compiler *this)

{
  Parser *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  ASTNode *root;
  STGV *this_01;
  TCV *this_02;
  CGV *this_03;
  long *plVar3;
  long *plVar4;
  string visualizerCommand;
  string moonCommand;
  undefined1 local_e8 [32];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  this_00 = this->parser;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"START","");
  Syntax::Parser::parse(this_00,&local_48,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  AST::ASTBuilder::visualize(this->parser->AST_Builder);
  root = AST::ASTBuilder::getRoot(this->parser->AST_Builder);
  this_01 = (STGV *)operator_new(0x60);
  STGV::STGV(this_01,root);
  this->symTabGenerator = this_01;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,&this_01->detector->errors);
  writeSymTabErrors(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,&this->symTabGenerator->detector->warnings);
  writeSymTabWarnings(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  writeSymTab(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,&this->symTabGenerator->detector->errors);
  uVar2 = local_e8._8_8_;
  uVar1 = local_e8._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  if (uVar1 == uVar2) {
    this_02 = (TCV *)operator_new(0x98);
    TCV::TCV(this_02,root,this->symTabGenerator);
    this->typeChecker = this_02;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8,&this_02->detector->errors);
    writeTypeCheckingErrors
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8,&this->typeChecker->detector->errors);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
    if (local_e8._0_8_ == local_e8._8_8_) {
      this_03 = (CGV *)operator_new(0x98);
      CGV::CGV(this_03,root,this->symTabGenerator->symbolTable);
      this->codeGenerator = this_03;
      writeMoonOutput(this);
      local_e8._0_8_ = (pointer)(local_e8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"dot -Tpng TreeContent.gv -o TreeContent.png","");
      extractFileName_abi_cxx11_(&local_68,this);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1393a6);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_98 = *plVar4;
        lStack_90 = plVar3[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar4;
        local_a8 = (long *)*plVar3;
      }
      local_a0 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_78 = *plVar4;
        lStack_70 = plVar3[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar4;
        local_88 = (long *)*plVar3;
      }
      local_80 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_b8 = *plVar4;
        lStack_b0 = plVar3[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar4;
        local_c8 = (long *)*plVar3;
      }
      local_c0 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      system((char *)local_e8._0_8_);
      system((char *)local_c8);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_e8._16_8_)->_M_p + 1));
      }
    }
  }
  return;
}

Assistant:

void Compiler::compile() {
    parser->parse("START");
    parser->AST_Builder->visualize();

    AST::ASTNode *root = parser->AST_Builder->getRoot();
    symTabGenerator = new STGV(root);
    writeSymTabErrors(symTabGenerator->getErrors());
    writeSymTabWarnings(symTabGenerator->getWarnings());
    writeSymTab();
    if (!symTabGenerator->getErrors().empty()) return;

    typeChecker = new TCV(root, symTabGenerator);
    writeTypeCheckingErrors(typeChecker->getErrors());

    if (!typeChecker->getErrors().empty()) return;

    codeGenerator = new CGV(root, symTabGenerator->symbolTable);
    writeMoonOutput();

    std::string visualizerCommand = "dot -Tpng TreeContent.gv -o TreeContent.png";
    std::string moonCommand = "Moon/moon Moon/Generated/" + extractFileName() + ".m" + " Moon/util.m";

    system(visualizerCommand.c_str());
    system(moonCommand.c_str());
}